

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_boundary_chain_methods<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
                *matrix)

{
  ID_index IVar1;
  pointer pIVar2;
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
  *pvVar3;
  Column_support *pCVar4;
  Column_support *pCVar5;
  ID_index IVar6;
  ID_index IVar7;
  undefined4 local_318;
  ID_index local_314;
  undefined1 *local_310;
  ID_index *local_308;
  undefined **local_300;
  undefined1 local_2f8;
  undefined8 *local_2f0;
  int **local_2e8;
  undefined **local_2e0;
  undefined1 local_2d8;
  undefined8 *local_2d0;
  undefined1 **local_2c8;
  undefined1 local_2c0 [8];
  undefined8 local_2b8;
  shared_count sStack_2b0;
  undefined **local_2a8;
  undefined1 local_2a0;
  undefined8 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
  *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x358);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  local_314 = (((matrix->
                super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->super_Chain_column_option).pivot_;
  local_308 = &local_314;
  local_318 = 5;
  local_2c0[0] = local_314 == 5;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  local_2e8 = (int **)&local_308;
  local_2f8 = 0;
  local_300 = &PTR__lazy_ostream_001fb8e8;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_310;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fb928;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x359);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  local_314 = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[1].super_Chain_column_option.pivot_;
  local_2c0[0] = local_314 == 6;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_318 = 6;
  local_2f8 = 0;
  local_2d8 = 0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  local_308 = &local_314;
  local_300 = &PTR__lazy_ostream_001fb8e8;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2e0 = &PTR__lazy_ostream_001fb928;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_310;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x359,1,2,2,"matrix[1].get_pivot()",&local_300,"6",
             &local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x35a);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  local_314 = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[2].super_Chain_column_option.pivot_;
  local_2c0[0] = local_314 == 6;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_318 = 6;
  local_2f8 = 0;
  local_2d8 = 0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  local_308 = &local_314;
  local_300 = &PTR__lazy_ostream_001fb8e8;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2e0 = &PTR__lazy_ostream_001fb928;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_310;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x35a,1,2,2,"matrix[2].get_pivot()",&local_300,"6",
             &local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x35b);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  local_314 = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[3].super_Chain_column_option.pivot_;
  local_2c0[0] = local_314 == 0xffffffff;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_318 = 0xffffffff;
  local_2f8 = 0;
  local_2d8 = 0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  local_308 = &local_314;
  local_300 = &PTR__lazy_ostream_001fb8e8;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2e0 = &PTR__lazy_ostream_001fb928;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_310;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x35b,1,2,2,"matrix[3].get_pivot()",&local_300,"-1",
             &local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x35c);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  local_314 = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[4].super_Chain_column_option.pivot_;
  local_2c0[0] = local_314 == 5;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_318 = 5;
  local_2f8 = 0;
  local_2d8 = 0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  local_308 = &local_314;
  local_300 = &PTR__lazy_ostream_001fb8e8;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2e0 = &PTR__lazy_ostream_001fb928;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_310;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x35c,1,2,2,"matrix[4].get_pivot()",&local_300,"5",
             &local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x35d);
  IVar6 = 0;
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  local_314 = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[5].super_Chain_column_option.pivot_;
  local_2c0[0] = local_314 == 6;
  local_318 = 6;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  local_308 = &local_314;
  local_2f8 = 0;
  local_300 = &PTR__lazy_ostream_001fb8e8;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fb928;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_310;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x35d,1,2,2,"matrix[5].get_pivot()",&local_300,"6",
             &local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x360);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  pIVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  IVar1 = (pIVar2->super_Chain_column_option).pivot_;
  if (IVar1 != 0xffffffff) {
    pCVar4 = &pIVar2->column_;
    pCVar5 = pCVar4;
    do {
      pCVar5 = *(Column_support **)&(pCVar5->super_type).data_.root_plus_size_;
      IVar6 = 0;
      if (pCVar5 == pCVar4) goto LAB_0019c53f;
    } while (*(ID_index *)(pCVar5 + 1) != IVar1);
    IVar6 = *(ID_index *)((Column_dimension_option *)(pCVar5 + -2) + 3);
  }
LAB_0019c53f:
  local_2c8 = &local_310;
  local_308 = &local_314;
  local_318 = 4;
  local_2c0[0] = IVar6 == 4;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  IVar7 = 0;
  local_2f8 = 0;
  local_300 = &PTR__lazy_ostream_001fb8e8;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fb8e8;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_314 = IVar6;
  local_310 = (undefined1 *)&local_318;
  local_278 = matrix;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x360,1,2,2,"matrix[0].get_pivot_value()",&local_300,
             "4u",&local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x361);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  pIVar2 = (local_278->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  IVar1 = pIVar2[1].super_Chain_column_option.pivot_;
  if (IVar1 != 0xffffffff) {
    pCVar4 = &pIVar2[1].column_;
    pCVar5 = pCVar4;
    do {
      pCVar5 = *(Column_support **)&(pCVar5->super_type).data_.root_plus_size_;
      IVar7 = 0;
      if (pCVar5 == pCVar4) goto LAB_0019c6b2;
    } while (*(ID_index *)(pCVar5 + 1) != IVar1);
    IVar7 = *(ID_index *)((Column_dimension_option *)(pCVar5 + -2) + 3);
  }
LAB_0019c6b2:
  local_2c8 = &local_310;
  local_308 = &local_314;
  local_318 = 1;
  local_2c0[0] = IVar7 == 1;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  IVar6 = 0;
  local_2f8 = 0;
  local_300 = &PTR__lazy_ostream_001fb8e8;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fb8e8;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_314 = IVar7;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x361,1,2,2,"matrix[1].get_pivot_value()",&local_300,
             "1u",&local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x362);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  pIVar2 = (local_278->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  IVar1 = pIVar2[2].super_Chain_column_option.pivot_;
  if (IVar1 != 0xffffffff) {
    pCVar4 = &pIVar2[2].column_;
    pCVar5 = pCVar4;
    do {
      pCVar5 = *(Column_support **)&(pCVar5->super_type).data_.root_plus_size_;
      IVar6 = 0;
      if (pCVar5 == pCVar4) goto LAB_0019c82a;
    } while (*(ID_index *)(pCVar5 + 1) != IVar1);
    IVar6 = *(ID_index *)((Column_dimension_option *)(pCVar5 + -2) + 3);
  }
LAB_0019c82a:
  local_2c8 = &local_310;
  local_308 = &local_314;
  local_318 = 4;
  local_2c0[0] = IVar6 == 4;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  IVar7 = 0;
  local_2f8 = 0;
  local_300 = &PTR__lazy_ostream_001fb8e8;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fb8e8;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_314 = IVar6;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x362,1,2,2,"matrix[2].get_pivot_value()",&local_300,
             "4u",&local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x363);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  pIVar2 = (local_278->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  IVar1 = pIVar2[3].super_Chain_column_option.pivot_;
  if (IVar1 != 0xffffffff) {
    pCVar4 = &pIVar2[3].column_;
    pCVar5 = pCVar4;
    do {
      pCVar5 = *(Column_support **)&(pCVar5->super_type).data_.root_plus_size_;
      IVar7 = 0;
      if (pCVar5 == pCVar4) goto LAB_0019c99f;
    } while (*(ID_index *)(pCVar5 + 1) != IVar1);
    IVar7 = *(ID_index *)((Column_dimension_option *)(pCVar5 + -2) + 3);
  }
LAB_0019c99f:
  local_2c8 = &local_310;
  local_308 = &local_314;
  local_318 = 0;
  local_2c0[0] = IVar7 == 0;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  IVar6 = 0;
  local_2f8 = 0;
  local_300 = &PTR__lazy_ostream_001fb8e8;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fb8e8;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_314 = IVar7;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x363,1,2,2,"matrix[3].get_pivot_value()",&local_300,
             "0u",&local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x364);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  pIVar2 = (local_278->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  IVar1 = pIVar2[4].super_Chain_column_option.pivot_;
  if (IVar1 != 0xffffffff) {
    pCVar4 = &pIVar2[4].column_;
    pCVar5 = pCVar4;
    do {
      pCVar5 = *(Column_support **)&(pCVar5->super_type).data_.root_plus_size_;
      IVar6 = 0;
      if (pCVar5 == pCVar4) goto LAB_0019cb2a;
    } while (*(ID_index *)(pCVar5 + 1) != IVar1);
    IVar6 = *(ID_index *)((Column_dimension_option *)(pCVar5 + -2) + 3);
  }
LAB_0019cb2a:
  local_2c8 = &local_310;
  local_308 = &local_314;
  local_318 = 4;
  local_2c0[0] = IVar6 == 4;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  IVar7 = 0;
  local_2f8 = 0;
  local_300 = &PTR__lazy_ostream_001fb8e8;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fb8e8;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_314 = IVar6;
  local_310 = (undefined1 *)&local_318;
  local_2e8 = (int **)&local_308;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x364,1,2,2,"matrix[4].get_pivot_value()",&local_300,
             "4u",&local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x365);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  pIVar2 = (local_278->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  IVar1 = pIVar2[5].super_Chain_column_option.pivot_;
  if (IVar1 != 0xffffffff) {
    pCVar4 = &pIVar2[5].column_;
    pCVar5 = pCVar4;
    do {
      pCVar5 = *(Column_support **)&(pCVar5->super_type).data_.root_plus_size_;
      IVar7 = 0;
      if (pCVar5 == pCVar4) goto LAB_0019cc9f;
    } while (*(ID_index *)(pCVar5 + 1) != IVar1);
    IVar7 = *(ID_index *)((Column_dimension_option *)(pCVar5 + -2) + 3);
  }
LAB_0019cc9f:
  local_2c8 = &local_310;
  local_308 = &local_314;
  local_318 = 1;
  local_2c0[0] = IVar7 == 1;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  local_2f8 = 0;
  local_300 = &PTR__lazy_ostream_001fb8e8;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fb8e8;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_314 = IVar7;
  local_310 = (undefined1 *)&local_318;
  local_2e8 = (int **)&local_308;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x365,1,2,2,"matrix[5].get_pivot_value()",&local_300,
             "1u",&local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x368);
  pvVar3 = local_278;
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  local_314 = (((local_278->
                super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->super_Column_dimension_option).dim_;
  local_2c0[0] = local_314 == 4;
  local_318 = 4;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  local_308 = &local_314;
  local_2f8 = 0;
  local_300 = &PTR__lazy_ostream_001fb928;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fb928;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_310;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x368,1,2,2,"matrix[0].get_dimension()",&local_300,"4",
             &local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x369);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  local_314 = (pvVar3->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[1].super_Column_dimension_option.dim_;
  local_2c0[0] = local_314 == 4;
  local_318 = 4;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  local_308 = &local_314;
  local_2f8 = 0;
  local_300 = &PTR__lazy_ostream_001fb928;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fb928;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_310;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x369,1,2,2,"matrix[1].get_dimension()",&local_300,"4",
             &local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x36a);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  local_314 = (pvVar3->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_2c0[0] = local_314 == 4;
  local_318 = 4;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  local_308 = &local_314;
  local_2f8 = 0;
  local_300 = &PTR__lazy_ostream_001fb928;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fb928;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_310;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x36a,1,2,2,"matrix[2].get_dimension()",&local_300,"4",
             &local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x36b);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  local_314 = (pvVar3->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[3].super_Column_dimension_option.dim_;
  local_2c0[0] = local_314 == 4;
  local_318 = 4;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  local_308 = &local_314;
  local_2f8 = 0;
  local_300 = &PTR__lazy_ostream_001fb928;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fb928;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_310;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x36b,1,2,2,"matrix[3].get_dimension()",&local_300,"4",
             &local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x36c);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  local_314 = (pvVar3->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[4].super_Column_dimension_option.dim_;
  local_2c0[0] = local_314 == 4;
  local_318 = 4;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  local_308 = &local_314;
  local_2f8 = 0;
  local_300 = &PTR__lazy_ostream_001fb928;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fb928;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_310;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x36c,1,2,2,"matrix[4].get_dimension()",&local_300,"4",
             &local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x36d);
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_001fb428;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = "";
  local_314 = (pvVar3->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_;
  local_2c0[0] = local_314 == 4;
  local_318 = 4;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_280 = "";
  local_308 = &local_314;
  local_2f8 = 0;
  local_300 = &PTR__lazy_ostream_001fb928;
  local_2f0 = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = (int **)&local_308;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fb928;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_310;
  local_310 = (undefined1 *)&local_318;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2a8,&local_288,0x36d,1,2,2,"matrix[5].get_dimension()",&local_300,"4",
             &local_2e0);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  return;
}

Assistant:

void column_test_boundary_chain_methods(std::vector<Column>& matrix) {
  BOOST_CHECK_EQUAL(matrix[0].get_pivot(), 5);
  BOOST_CHECK_EQUAL(matrix[1].get_pivot(), 6);
  BOOST_CHECK_EQUAL(matrix[2].get_pivot(), 6);
  BOOST_CHECK_EQUAL(matrix[3].get_pivot(), -1);
  BOOST_CHECK_EQUAL(matrix[4].get_pivot(), 5);
  BOOST_CHECK_EQUAL(matrix[5].get_pivot(), 6);

  if constexpr (!is_z2<Column>()) {
    BOOST_CHECK_EQUAL(matrix[0].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[1].get_pivot_value(), 1u);
    BOOST_CHECK_EQUAL(matrix[2].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[3].get_pivot_value(), 0u);
    BOOST_CHECK_EQUAL(matrix[4].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[5].get_pivot_value(), 1u);
  }

  BOOST_CHECK_EQUAL(matrix[0].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[1].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[2].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[3].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[4].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[5].get_dimension(), 4);
}